

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O0

void Aig_ManPackSetRandom(Aig_ManPack_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int local_24;
  int i;
  word Sign;
  Aig_Obj_t *pObj;
  Aig_ManPack_t *p_local;
  
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->pAig->vCis), local_24 < iVar1; local_24 = local_24 + 1)
  {
    Vec_PtrEntry(p->pAig->vCis,local_24);
    uVar2 = Aig_ManRandom(0);
    uVar3 = Aig_ManRandom(0);
    Vec_WrdWriteEntry(p->vPiPats,local_24,CONCAT44(uVar2,uVar3) << 1);
  }
  return;
}

Assistant:

void Aig_ManPackSetRandom( Aig_ManPack_t * p )
{
    Aig_Obj_t * pObj;
    word Sign;
    int i;
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        Sign = (((word)Aig_ManRandom(0)) << 32) | ((word)Aig_ManRandom(0));
        Vec_WrdWriteEntry( p->vPiPats, i, Sign << 1 );
    }
}